

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O3

int main(void)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  Rect rct;
  Rect rct_00;
  Rect rct_01;
  Rect rct_02;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  TerminalInfo *pTVar13;
  BrailleCanvas *pBVar14;
  ulong uVar15;
  long lVar16;
  ostream *poVar17;
  bool bVar18;
  long lVar19;
  byte bVar20;
  long lVar22;
  ulong uVar23;
  byte bVar24;
  byte bVar25;
  ulong uVar26;
  byte bVar27;
  ulong uVar28;
  float fVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  Size char_sz;
  initializer_list<plot::GenericPoint<long>_> __l;
  Point from;
  Point from_00;
  Point from_01;
  Point from_02;
  Point p;
  Point p_00;
  Point to;
  Point to_00;
  Point to_01;
  Point to_02;
  vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_> points;
  BrailleCanvas canvas;
  Rect strokeArea;
  allocator_type local_1ea;
  byte local_1e9;
  long local_1e8;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  long local_1b8;
  ulong local_1b0;
  long local_1a8;
  vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_> local_1a0;
  undefined1 local_188 [12];
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  GenericPoint<long> local_148;
  long local_138;
  long local_130;
  ulong local_128;
  ulong local_120;
  long local_118;
  long local_110;
  ulong local_108;
  ulong local_100;
  long local_f8;
  long local_f0;
  BrailleCanvas local_e8;
  Rect local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  bool bVar21;
  
  local_188._0_4_ = None;
  local_188._4_4_ = 0.9;
  local_188._8_4_ = 0.9;
  fStack_17c = 0.9;
  fStack_178 = 1.0;
  fStack_174 = 0.0;
  uStack_170._0_4_ = 0.0;
  uStack_170._4_4_ = 0.0;
  uStack_168._0_4_ = 1.0;
  uStack_168._4_4_ = 1;
  pTVar13 = plot::TerminalInfo::detect<void>((TerminalInfo *)local_188);
  local_58._0_4_ = pTVar13->mode;
  local_58._4_4_ = (pTVar13->foreground_color).r;
  uStack_50._0_4_ = (pTVar13->foreground_color).g;
  uStack_50._4_4_ = (pTVar13->foreground_color).b;
  local_48 = *(undefined8 *)&(pTVar13->foreground_color).a;
  uStack_40._0_4_ = (pTVar13->background_color).g;
  uStack_40._4_4_ = (pTVar13->background_color).b;
  local_38 = *(undefined8 *)&(pTVar13->background_color).a;
  char_sz.y = 0x14;
  char_sz.x = 0x46;
  plot::BrailleCanvas::BrailleCanvas(&local_e8,char_sz,*pTVar13);
  rct.p1.y = 0xb;
  rct.p1.x = 0xb;
  rct.p2.x = 0x28;
  rct.p2.y = 0x28;
  plot::BrailleCanvas::rect
            (&local_e8,(Color *)plot::palette::firebrick,(Color *)plot::palette::blueviolet,rct,Over
            );
  pBVar14 = plot::BrailleCanvas::push(&local_e8);
  from.y = 0x11;
  from.x = 0xc;
  to.y = 0x27;
  to.x = 0x11;
  pBVar14 = plot::BrailleCanvas::line(pBVar14,(Color *)plot::palette::limegreen,from,to,Over);
  from_00.y = 0x27;
  from_00.x = 0x11;
  to_00.y = 0x22;
  to_00.x = 0x27;
  pBVar14 = plot::BrailleCanvas::line(pBVar14,(Color *)plot::palette::limegreen,from_00,to_00,Over);
  from_01.y = 0x22;
  from_01.x = 0x27;
  to_01.y = 0xc;
  to_01.x = 0x22;
  pBVar14 = plot::BrailleCanvas::line(pBVar14,(Color *)plot::palette::limegreen,from_01,to_01,Over);
  from_02.y = 0xc;
  from_02.x = 0x22;
  to_02.y = 0x11;
  to_02.x = 0xc;
  plot::BrailleCanvas::line(pBVar14,(Color *)plot::palette::limegreen,from_02,to_02,Over);
  plot::BrailleCanvas::pop(&local_e8,ClipDst);
  rct_00.p1.y = 0xb;
  rct_00.p1.x = 0x2d;
  rct_00.p2.x = 0x4b;
  rct_00.p2.y = 0x29;
  plot::BrailleCanvas::ellipse(&local_e8,(Color *)plot::palette::slategrey,rct_00,Over);
  local_188._0_4_ = 0x32;
  local_188._4_4_ = 0.0;
  local_188._8_4_ = 1.96182e-44;
  fStack_17c = 0.0;
  fStack_178 = 9.80909e-44;
  fStack_174 = 0.0;
  uStack_170._0_4_ = 5.32493e-44;
  uStack_170._4_4_ = 0.0;
  rct_01.p1.y = 0xe;
  rct_01.p1.x = 0x32;
  rct_01.p2.x = 0x46;
  rct_01.p2.y = 0x26;
  plot::BrailleCanvas::ellipse
            (&local_e8,(Color *)plot::palette::green,(Color *)plot::palette::yellow,rct_01,Over);
  local_78.p2.x = 0x47;
  local_78.p2.y = 0x47;
  local_78.p1.x = 0xc;
  local_78.p1.y = 0x2e;
  plot::BrailleCanvas::rect(&local_e8,(Color *)plot::palette::lightcyan,&local_78,Over);
  plot::BrailleCanvas::push(&local_e8);
  rct_02.p1.y = local_78.p1.y;
  rct_02.p1.x = local_78.p1.x;
  rct_02.p2.x = local_78.p2.x;
  rct_02.p2.y = local_78.p2.y;
  plot::BrailleCanvas::stroke<std::pair<long,long>(&)(long)>
            (&local_e8,(Color *)plot::palette::royalblue,rct_02,sinStrokeFunction,Over);
  uVar28 = local_78.p2.x;
  if (local_78.p1.x < local_78.p2.x) {
    uVar28 = local_78.p1.x;
  }
  uVar26 = local_78.p2.x;
  if (local_78.p2.x < local_78.p1.x) {
    uVar26 = local_78.p1.x;
  }
  local_128 = local_78.p2.y;
  if (local_78.p1.y < local_78.p2.y) {
    local_128 = local_78.p1.y;
  }
  uVar23 = local_78.p2.y;
  if (local_78.p2.y < local_78.p1.y) {
    uVar23 = local_78.p1.y;
  }
  uVar8 = local_e8.cols_ * 2;
  uVar15 = local_e8.lines_ * 4;
  if ((long)uVar28 < 1) {
    uVar28 = 0;
  }
  if (SBORROW8(uVar28,uVar8) == (long)(uVar28 + local_e8.cols_ * -2) < 0) {
    uVar28 = uVar8;
  }
  if ((long)local_128 < 1) {
    local_128 = 0;
  }
  if ((long)uVar15 <= (long)local_128) {
    local_128 = uVar15;
  }
  if ((long)uVar26 < 0) {
    uVar26 = 0xffffffffffffffff;
  }
  uVar26 = uVar26 + 1;
  if (SBORROW8(uVar26,uVar8) == (long)(uVar26 + local_e8.cols_ * -2) < 0) {
    uVar26 = uVar8;
  }
  if ((long)uVar23 < 0) {
    uVar23 = 0xffffffffffffffff;
  }
  local_120 = uVar23 + 1;
  if ((long)uVar15 <= (long)(uVar23 + 1)) {
    local_120 = uVar15;
  }
  uVar23 = local_128 + 3;
  if (-1 < (long)local_128) {
    uVar23 = local_128;
  }
  local_1e8 = (long)uVar23 >> 2;
  local_1b8 = uVar26 - (long)uVar26 / 2;
  if (local_1b8 < 2) {
    local_1b8 = 1;
  }
  uVar23 = local_120 + 3;
  if (-1 < (long)local_120) {
    uVar23 = local_120;
  }
  local_110 = (((long)uVar23 >> 2) + 1) - (ulong)((local_120 & 3) == 0);
  if (local_110 < 2) {
    local_110 = 1;
  }
  if (local_1e8 < local_110) {
    local_118 = (long)uVar28 / 2;
    local_130 = local_118 - local_1b8;
    local_138 = local_118 * 2;
    local_1a8 = local_1e8 * 0x14;
    local_148.y = local_118 * 10 + 4;
    local_108 = uVar28;
    local_100 = uVar26;
    do {
      if (local_118 < local_1b8) {
        local_1d0 = local_1e8 * 4;
        local_1e9 = (local_120 != local_1d0 &&
                    SBORROW8(local_120,local_1d0) == (long)(local_120 + local_1e8 * -4) < 0) &&
                    (local_128 == local_1d0 ||
                    SBORROW8(local_128,local_1d0) != (long)(local_128 + local_1e8 * -4) < 0);
        local_1b0 = local_1d0 | 1;
        bVar2 = (long)local_1b0 < (long)local_128;
        bVar5 = (long)local_120 <= (long)local_1b0;
        local_1c0 = local_1d0 | 2;
        bVar3 = (long)local_1c0 < (long)local_128;
        bVar6 = (long)local_120 <= (long)local_1c0;
        local_1c8 = local_1d0 | 3;
        bVar4 = (long)local_1c8 < (long)local_128;
        bVar7 = (long)local_120 <= (long)local_1c8;
        lVar22 = local_138;
        lVar16 = local_148.y;
        lVar19 = local_130;
        do {
          bVar24 = local_1e9;
          bVar11 = (long)uVar28 <= lVar22;
          bVar21 = lVar22 < (long)uVar26;
          local_f8 = lVar19;
          local_f0 = lVar16;
          if (((bVar21 && bVar11) & local_1e9) == 1) {
            fVar29 = cosf(((float)(lVar22 + -0xc) / 30.0) * 6.283184);
            lVar16 = lroundf(fVar29 * 10.0);
            lVar19 = 0x3a - lVar16;
            if (lVar16 < 1) {
              bVar10 = 0xe < local_1e8;
              bVar18 = (long)local_1d0 <= lVar19;
            }
            else {
              bVar10 = local_1e8 < 0xf;
              bVar18 = lVar19 <= (long)local_1d0;
            }
            local_1d4 = (undefined4)CONCAT71((int7)((ulong)lVar19 >> 8),bVar18 & bVar10);
          }
          else {
            local_1d4 = 0;
          }
          if ((!bVar21 || !bVar11) || (bVar5 || bVar2)) {
            local_1d8 = 0;
          }
          else {
            fVar29 = cosf(((float)(lVar22 + -0xc) / 30.0) * 6.283184);
            lVar16 = lroundf(fVar29 * 10.0);
            lVar19 = 0x3a - lVar16;
            if (lVar16 < 1) {
              bVar10 = 0xe < local_1e8;
              bVar18 = (long)local_1d0 < lVar19;
            }
            else {
              bVar10 = (long)local_1b0 < 0x3b;
              bVar18 = lVar19 <= (long)local_1b0;
            }
            local_1d8 = (undefined4)CONCAT71((int7)((ulong)lVar19 >> 8),bVar18 & bVar10);
          }
          if ((!bVar21 || !bVar11) || (bVar6 || bVar3)) {
            local_1dc = 0;
          }
          else {
            fVar29 = cosf(((float)(lVar22 + -0xc) / 30.0) * 6.283184);
            lVar16 = lroundf(fVar29 * 10.0);
            lVar19 = 0x3a - lVar16;
            if (lVar16 < 1) {
              bVar10 = 0x39 < (long)local_1c0;
              bVar18 = (long)local_1c0 <= lVar19;
            }
            else {
              bVar10 = (long)local_1c0 < 0x3b;
              bVar18 = lVar19 <= (long)local_1c0;
            }
            local_1dc = (undefined4)CONCAT71((int7)((ulong)lVar19 >> 8),bVar18 & bVar10);
          }
          if ((!bVar21 || !bVar11) || (bVar7 || bVar4)) {
            bVar20 = 0;
          }
          else {
            fVar29 = cosf(((float)(lVar22 + -0xc) / 30.0) * 6.283184);
            lVar16 = lroundf(fVar29 * 10.0);
            if (lVar16 < 1) {
              bVar11 = 0x39 < (long)local_1c8;
              bVar21 = (long)local_1c8 <= 0x3a - lVar16;
            }
            else {
              bVar11 = (long)local_1c8 < 0x3b;
              bVar21 = 0x3a - lVar16 <= (long)local_1c8;
            }
            bVar20 = bVar21 & bVar11;
          }
          bVar11 = (long)uVar28 <= lVar22 + 1;
          bVar21 = lVar22 + 1 < (long)uVar26;
          if (((bVar21 && bVar11) & bVar24) == 1) {
            fVar29 = cosf(((float)(lVar22 + -0xb) / 30.0) * 6.283184);
            lVar16 = lroundf(fVar29 * 10.0);
            if (lVar16 < 1) {
              bVar10 = 0xe < local_1e8;
              bVar18 = (long)local_1d0 <= 0x3a - lVar16;
            }
            else {
              bVar10 = local_1e8 < 0xf;
              bVar18 = 0x3a - lVar16 <= (long)local_1d0;
            }
            bVar24 = bVar18 & bVar10;
          }
          else {
            bVar24 = 0;
          }
          if ((!bVar21 || !bVar11) || (bVar5 || bVar2)) {
            bVar25 = 0;
          }
          else {
            fVar29 = cosf(((float)(lVar22 + -0xb) / 30.0) * 6.283184);
            lVar16 = lroundf(fVar29 * 10.0);
            if (lVar16 < 1) {
              bVar10 = 0xe < local_1e8;
              bVar18 = (long)local_1d0 < 0x3a - lVar16;
            }
            else {
              bVar10 = (long)local_1b0 < 0x3b;
              bVar18 = 0x3a - lVar16 <= (long)local_1b0;
            }
            bVar25 = bVar18 & bVar10;
          }
          if ((!bVar21 || !bVar11) || (bVar6 || bVar3)) {
            bVar27 = 0;
          }
          else {
            fVar29 = cosf(((float)(lVar22 + -0xb) / 30.0) * 6.283184);
            lVar16 = lroundf(fVar29 * 10.0);
            if (lVar16 < 1) {
              bVar10 = 0x39 < (long)local_1c0;
              bVar18 = (long)local_1c0 <= 0x3a - lVar16;
            }
            else {
              bVar10 = (long)local_1c0 < 0x3b;
              bVar18 = 0x3a - lVar16 <= (long)local_1c0;
            }
            bVar27 = bVar18 & bVar10;
          }
          if ((!bVar21 || !bVar11) || (bVar7 || bVar4)) {
            bVar12 = 0;
          }
          else {
            fVar29 = cosf(((float)(lVar22 + -0xb) / 30.0) * 6.283184);
            lVar16 = lroundf(fVar29 * 10.0);
            if (lVar16 < 1) {
              bVar11 = 0x39 < (long)local_1c8;
              bVar21 = (long)local_1c8 <= 0x3a - lVar16;
            }
            else {
              bVar11 = (long)local_1c8 < 0x3b;
              bVar21 = 0x3a - lVar16 <= (long)local_1c8;
            }
            bVar12 = bVar21 & bVar11;
          }
          lVar16 = local_e8.cols_ * local_1a8;
          bVar20 = bVar12 << 7 |
                   bVar27 << 5 |
                   bVar25 << 4 |
                   bVar24 << 3 |
                   bVar20 << 6 | (char)local_1dc << 2 | (char)local_1d8 * '\x02' + (char)local_1d4;
          bVar24 = *(byte *)((long)&((local_e8.blocks_.
                                      super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                                      .
                                      super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->color).b +
                            local_f0 * 2 + lVar16);
          if (bVar20 == 0) {
LAB_00103dea:
            uVar1 = *(undefined8 *)
                     ((long)local_e8.blocks_.
                            super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                            .
                            super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_f0 * 2 + lVar16 + -8);
            uVar30 = (undefined4)uVar1;
            uVar31 = (undefined4)((ulong)uVar1 >> 0x20);
            uVar1 = *(undefined8 *)
                     ((long)&((local_e8.blocks_.
                               super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                               .
                               super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                               ._M_impl.super__Vector_impl_data._M_start)->color).r +
                     local_f0 * 2 + lVar16);
            uVar32 = (undefined4)uVar1;
            uVar33 = (undefined4)((ulong)uVar1 >> 0x20);
            bVar20 = bVar24;
          }
          else {
            uVar30 = 0x3f7ae148;
            uVar31 = 0x3f008312;
            uVar32 = 0x3ee4dd2f;
            uVar33 = 0x3f800000;
            if (bVar24 != 0) goto LAB_00103dea;
          }
          *(ulong *)((long)local_e8.blocks_.
                           super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                           .
                           super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                           ._M_impl.super__Vector_impl_data._M_start + local_f0 * 2 + lVar16 + -8) =
               CONCAT44(uVar31,uVar30);
          *(ulong *)((long)&((local_e8.blocks_.
                              super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                              .
                              super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)->color).r +
                    local_f0 * 2 + lVar16) = CONCAT44(uVar33,uVar32);
          *(byte *)((long)&((local_e8.blocks_.
                             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                             .
                             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                             ._M_impl.super__Vector_impl_data._M_start)->color).b +
                   local_f0 * 2 + lVar16) = bVar20;
          lVar22 = lVar22 + 2;
          lVar16 = local_f0 + 10;
          lVar19 = local_f8 + 1;
          uVar26 = local_100;
          uVar28 = local_108;
        } while (lVar19 != 0);
      }
      local_1e8 = local_1e8 + 1;
      local_1a8 = local_1a8 + 0x14;
    } while (local_1e8 != local_110);
  }
  plot::BrailleCanvas::pop(&local_e8,Over);
  plot::BrailleCanvas::dot(&local_e8,(Color *)plot::palette::orange,(Point)ZEXT816(0),Over);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_e8.lines_ * 4 - 1;
  plot::BrailleCanvas::dot(&local_e8,(Color *)plot::palette::purple,(Point)(auVar9 << 0x40),Over);
  p.y = 0;
  p.x = local_e8.cols_ * 2 - 1;
  plot::BrailleCanvas::dot(&local_e8,(Color *)plot::palette::gold,p,Over);
  p_00.y = local_e8.lines_ * 4 + -1;
  p_00.x = local_e8.cols_ * 2 + -1;
  plot::BrailleCanvas::dot(&local_e8,(Color *)plot::palette::indigo,p_00,Over);
  local_158 = 0x52;
  uStack_150 = 0x19;
  uStack_168._0_4_ = 1.4013e-43;
  uStack_168._4_4_ = 0;
  uStack_160 = 0xf;
  fStack_178 = 1.12104e-43;
  fStack_174 = 0.0;
  uStack_170._0_4_ = 1.68156e-44;
  uStack_170._4_4_ = 0.0;
  local_188._0_4_ = 0x62;
  local_188._4_4_ = 0.0;
  local_188._8_4_ = 4.2039e-44;
  fStack_17c = 0.0;
  plot::BrailleCanvas::path<plot::GenericPoint<long>const*>
            (&local_e8,(Color *)plot::palette::deepskyblue,(GenericPoint<long> *)local_188,
             &local_148,Over);
  local_158 = 0x52;
  uStack_150 = 0x37;
  uStack_168._0_4_ = 1.4013e-43;
  uStack_168._4_4_ = 0;
  uStack_160 = 0x41;
  fStack_178 = 1.12104e-43;
  fStack_174 = 0.0;
  uStack_170._0_4_ = 9.52883e-44;
  uStack_170._4_4_ = 0.0;
  local_188._0_4_ = 0x62;
  local_188._4_4_ = 0.0;
  local_188._8_4_ = 7.00649e-44;
  fStack_17c = 0.0;
  __l._M_len = 4;
  __l._M_array = (iterator)local_188;
  std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>::vector
            (&local_1a0,__l,&local_1ea);
  plot::BrailleCanvas::
  path<__gnu_cxx::__normal_iterator<plot::GenericPoint<long>*,std::vector<plot::GenericPoint<long>,std::allocator<plot::GenericPoint<long>>>>>
            (&local_e8,(Color *)plot::palette::mediumseagreen,
             (__normal_iterator<plot::GenericPoint<long>_*,_std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>_>
              )local_1a0.
               super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<plot::GenericPoint<long>_*,_std::vector<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>_>
              )local_1a0.
               super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,Over);
  local_188._0_8_ = &local_e8;
  unique0x100015e8 =
       local_e8.blocks_.
       super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       .
       super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (local_e8.blocks_.
      super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
      super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_e8.blocks_.
      super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
      super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      poVar17 = plot::detail::braille::operator<<((ostream *)&std::cout,(line_t *)local_188);
      local_1ea = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)&local_1ea,1);
      register0x00000000 = stack0xfffffffffffffe80 + *(size_t *)(local_188._0_8_ + 8);
    } while (register0x00000000 !=
             local_e8.blocks_.
             super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             .
             super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if (local_1a0.
      super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (GenericPoint<long> *)0x0) {
    operator_delete(local_1a0.
                    super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a0.
                          super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a0.
                          super__Vector_base<plot::GenericPoint<long>,_std::allocator<plot::GenericPoint<long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>::
  ~_Fwd_list_base(&local_e8.available_layers_.
                   super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
                 );
  std::
  _Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>::
  ~_Fwd_list_base(&local_e8.stack_.
                   super__Fwd_list_base<plot::detail::braille::image_t,_std::allocator<plot::detail::braille::image_t>_>
                 );
  if (local_e8.blocks_.
      super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>.
      super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.blocks_.
                    super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                    .
                    super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.blocks_.
                          super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          .
                          super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.blocks_.
                          super_vector<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          .
                          super__Vector_base<plot::detail::braille::block_t,_std::allocator<plot::detail::braille::block_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    // Each Braille Canvas is made up of cells that are 2x4 points
    // Points are switched on and off individually, but color is stored
    // per cell.
    constexpr Coord canvasCellCols = 70;
    constexpr Coord canvasCellRows = 20;
    constexpr Size canvasCellSize(canvasCellCols, canvasCellRows);

    BrailleCanvas canvas(canvasCellSize, TerminalInfo().detect());
    // The grid of the canvas is 70*2 x 20*4 or 140x80 points
    // so all future coordinates for where to draw objects are
    // relative to the 140x80 points with the origin (i.e. Point{0,0}) in the upper
    // left hand corner.

    // First draw a rectangle with a 'firebrick' outline and 'blueviolet' filling from point
    // location 11,11 to 40,40
    constexpr Point upperLeft(11, 11);
    constexpr Point lowerRight(40, 40);
    constexpr Rect filledRectangle(upperLeft, lowerRight);
    canvas.rect(palette::firebrick, palette::blueviolet, filledRectangle);

    // Draw lines in 'limegreen' overlayed onto the canvas
    // note that each method returns a reference to the object so
    // that commands can be easily chained together.

    // Push the current image to a stack and create a new clean image
    canvas.push()
          .line(palette::limegreen, { 12, 17 }, { 17, 39 })
          .line(palette::limegreen, { 17, 39 }, { 39, 34 })
          .line(palette::limegreen, { 39, 34 }, { 34, 12 })
          .line(palette::limegreen, { 34, 12 }, { 12, 17 });

    // Pop the previous image from the stack and composite the current
    // one onto it
    //
    // Most drawing commands can take an optional compositing operation
    // as their last argument. Three operations are available:
    //   - TerminalOp::Over = Paint source over destination, mix cell colors
    //   - TerminalOp::ClipDst = Erase destination cell where source is not empty
    //   - TerminalOp::ClipSrc = Ignore source cell where destination is not empty
    canvas.pop(TerminalOp::ClipDst);

    // Draw an ellipse in a bounding box from {0,0} to {30,30} offset by {45,11}
    constexpr Rect greyEllipseBoundingBox = Rect({ 30, 30 }) + Point(45, 11);
    canvas.ellipse(palette::slategrey, greyEllipseBoundingBox);
    // Draw an elipse with green outline, filled with yellow centered at {60,26} with  semi-axes of {10,12}
    canvas.ellipse(palette::green, palette::yellow, { 60, 26 }, { 10, 12 });

    // Bounding box for where the stroke functions are rendered.
    constexpr Coord xStart = 12;
    constexpr Coord xStop  = 71;
    constexpr Coord yStart = 46;
    constexpr Coord yStop  = 71;
    constexpr Rect strokeArea({ xStart, yStart }, { xStop, yStop });
    canvas.rect(palette::lightcyan, strokeArea);

    canvas.push();

    // Stroke a custom shaped line in 'royalblue' color
    //
    // The function 'sinStrokeFunction' will be evaluated at each value in [xStart, xStop]
    // and stroke in the color of 'royalblue' will be rendered for those coordinates.
    // Output will be clipped to range [yStart, yStop].
    canvas.stroke(palette::royalblue, strokeArea, sinStrokeFunction);

    constexpr float amplitude = 10;
    constexpr Coord vCenter = (yStop + yStart) / 2;

    // Fill cosine area using a custom lambda function returning true for
    // points inside the colored area.
    canvas.fill(palette::salmon, strokeArea, [](Point p) {
        Coord value = vCenter - std::lround(amplitude*std::cos(2*3.141592f*((p.x - xStart)/30.0f)));

        if (value < vCenter)
            return p.y <= vCenter && p.y >= value;
        else
            return p.y >= vCenter && p.y <= value;
     }, TerminalOp::ClipSrc);
     canvas.pop(TerminalOp::Over);

    // Place a dot in each corner of the pixel grid
    canvas.dot(palette::orange, { 0, 0 });
    canvas.dot(palette::purple, { 0, canvas.size().y - 1 });
    canvas.dot(palette::gold,   { canvas.size().x - 1, 0 });
    canvas.dot(palette::indigo, canvas.size() - Point(1, 1));

    // Draw a chain of lines from a sequence of points (initializer list)
    canvas.path(palette::deepskyblue, {
        { 98, 30 },
        { 80, 12 },
        { 100, 15 },
        { 82, 25 }
    });

    std::vector<Point> points{
        { 98, 50 },
        { 80, 68 },
        { 100, 65 },
        { 82, 55 }
    };

    // Draw a chain of lines from a sequence of points (iterators)
    canvas.path(palette::mediumseagreen, points.begin(), points.end());

    // Write the canvas to stdout
    std::cout << canvas << std::endl;

    return 0;
}